

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mqtt_client.c
# Opt level: O0

void mqtt_client_dowork(MQTT_CLIENT_HANDLE handle)

{
  tickcounter_ms_t mqtt_client_00;
  _Bool _Var1;
  int iVar2;
  LOGGER_LOG p_Var3;
  BUFFER_HANDLE handle_00;
  size_t length;
  uchar *data;
  STRING_HANDLE trace_log_00;
  STRING_HANDLE trace_log;
  size_t size;
  BUFFER_HANDLE pingPacket;
  LOGGER_LOG l;
  tickcounter_ms_t current_ms;
  MQTT_CLIENT *mqtt_client;
  MQTT_CLIENT_HANDLE handle_local;
  
  if ((handle != (MQTT_CLIENT_HANDLE)0x0) && (handle->xioHandle != (XIO_HANDLE)0x0)) {
    current_ms = (tickcounter_ms_t)handle;
    mqtt_client = handle;
    if ((handle->mqtt_status & 4) == 0) {
      xio_dowork(handle->xioHandle);
      if ((((*(ushort *)(current_ms + 0xa0) & 2) != 0) &&
          ((*(ushort *)(current_ms + 0xa0) & 1) != 0)) && (*(short *)(current_ms + 100) != 0)) {
        iVar2 = tickcounter_get_current_ms
                          (*(TICK_COUNTER_HANDLE *)(current_ms + 0x18),(tickcounter_ms_t *)&l);
        if (iVar2 == 0) {
          if ((*(long *)(current_ms + 0xa8) == 0) ||
             ((ulong)((long)l - *(long *)(current_ms + 0xa8)) / 1000 <=
              (ulong)*(ushort *)(current_ms + 0xb0))) {
            if (((ulong)*(ushort *)(current_ms + 100) <=
                 (ulong)((long)l - *(long *)(current_ms + 0x20)) / 1000) &&
               (handle_00 = mqtt_codec_ping(), handle_00 != (BUFFER_HANDLE)0x0)) {
              length = BUFFER_length(handle_00);
              mqtt_client_00 = current_ms;
              data = BUFFER_u_char(handle_00);
              sendPacketItem((MQTT_CLIENT *)mqtt_client_00,data,length);
              BUFFER_delete(handle_00);
              tickcounter_get_current_ms
                        (*(TICK_COUNTER_HANDLE *)(current_ms + 0x18),
                         (tickcounter_ms_t *)(current_ms + 0xa8));
              _Var1 = is_trace_enabled((MQTT_CLIENT *)current_ms);
              if (_Var1) {
                trace_log_00 = STRING_construct("PINGREQ");
                log_outgoing_trace((MQTT_CLIENT *)current_ms,trace_log_00);
                STRING_delete(trace_log_00);
              }
            }
          }
          else {
            set_error_callback((MQTT_CLIENT *)current_ms,MQTT_CLIENT_NO_PING_RESPONSE);
            *(undefined8 *)(current_ms + 0xa8) = 0;
            *(undefined8 *)(current_ms + 0x20) = 0;
            *(undefined4 *)(current_ms + 0x10) = 0xe2;
          }
        }
        else {
          p_Var3 = xlogging_get_log_function();
          if (p_Var3 != (LOGGER_LOG)0x0) {
            (*p_Var3)(AZ_LOG_ERROR,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/umqtt/src/mqtt_client.c"
                      ,"mqtt_client_dowork",0x57f,1,"Error: tickcounter_get_current_ms failed");
          }
        }
      }
    }
    else {
      close_connection(handle);
      *(ushort *)(current_ms + 0xa0) = *(ushort *)(current_ms + 0xa0) & 0xfffb;
    }
  }
  return;
}

Assistant:

void mqtt_client_dowork(MQTT_CLIENT_HANDLE handle)
{
    MQTT_CLIENT* mqtt_client = (MQTT_CLIENT*)handle;
    /*Codes_SRS_MQTT_CLIENT_18_001: [If the client is disconnected, mqtt_client_dowork shall do nothing.]*/
    /*Codes_SRS_MQTT_CLIENT_07_023: [If the parameter handle is NULL then mqtt_client_dowork shall do nothing.]*/
    if (mqtt_client != NULL && mqtt_client->xioHandle != NULL)
    {
        if (mqtt_client->mqtt_status & MQTT_STATUS_PENDING_CLOSE)
        {
            close_connection(mqtt_client);
            // turn off pending close
            mqtt_client->mqtt_status &= ~MQTT_STATUS_PENDING_CLOSE;
        }
        else
        {
            /*Codes_SRS_MQTT_CLIENT_07_024: [mqtt_client_dowork shall call the xio_dowork function to complete operations.]*/
            xio_dowork(mqtt_client->xioHandle);

            /*Codes_SRS_MQTT_CLIENT_07_025: [mqtt_client_dowork shall retrieve the the last packet send value and ...]*/
            if (mqtt_client->mqtt_status & MQTT_STATUS_SOCKET_CONNECTED &&
                mqtt_client->mqtt_status & MQTT_STATUS_CLIENT_CONNECTED &&
                mqtt_client->keepAliveInterval > 0)
            {
                tickcounter_ms_t current_ms;
                if (tickcounter_get_current_ms(mqtt_client->packetTickCntr, &current_ms) != 0)
                {
                    LogError("Error: tickcounter_get_current_ms failed");
                }
                else
                {
                    /* Codes_SRS_MQTT_CLIENT_07_035: [If the timeSincePing has expired past the maxPingRespTime then mqtt_client_dowork shall call the Error Callback function with the message MQTT_CLIENT_NO_PING_RESPONSE] */
                    if (mqtt_client->timeSincePing > 0 && ((current_ms - mqtt_client->timeSincePing)/1000) > mqtt_client->maxPingRespTime)
                    {
                        // We haven't gotten a ping response in the alloted time
                        set_error_callback(mqtt_client, MQTT_CLIENT_NO_PING_RESPONSE);
                        mqtt_client->timeSincePing = 0;
                        mqtt_client->packetSendTimeMs = 0;
                        mqtt_client->packetState = UNKNOWN_TYPE;
                    }
                    else if (((current_ms - mqtt_client->packetSendTimeMs) / 1000) >= mqtt_client->keepAliveInterval)
                    {
                        /*Codes_SRS_MQTT_CLIENT_07_026: [if keepAliveInternal is > 0 and the send time is greater than the MQTT KeepAliveInterval then it shall construct an MQTT PINGREQ packet.]*/
                        BUFFER_HANDLE pingPacket = mqtt_codec_ping();
                        if (pingPacket != NULL)
                        {
                            size_t size = BUFFER_length(pingPacket);
                            (void)sendPacketItem(mqtt_client, BUFFER_u_char(pingPacket), size);
                            BUFFER_delete(pingPacket);
                            (void)tickcounter_get_current_ms(mqtt_client->packetTickCntr, &mqtt_client->timeSincePing);

                            if (is_trace_enabled(mqtt_client))
                            {
                                STRING_HANDLE trace_log = STRING_construct("PINGREQ");
                                log_outgoing_trace(mqtt_client, trace_log);
                                STRING_delete(trace_log);
                            }
                        }
                    }
                }
            }
        }
    }
}